

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_platform_sdl2.c
# Opt level: O1

void FAudio_PlatformAddRef(void)

{
  uint8_t hasSSE2;
  uint8_t hasNEON;
  int iVar1;
  undefined8 uVar2;
  
  iVar1 = SDL_InitSubSystem(0x10);
  if (iVar1 < 0) {
    uVar2 = SDL_GetError();
    SDL_Log("SDL_INIT_AUDIO failed: %s\n",uVar2);
  }
  hasSSE2 = SDL_HasSSE2();
  hasNEON = SDL_HasNEON();
  FAudio_INTERNAL_InitSIMDFunctions(hasSSE2,hasNEON);
  return;
}

Assistant:

void FAudio_PlatformAddRef()
{
	/* SDL tracks ref counts for each subsystem */
	if (SDL_InitSubSystem(SDL_INIT_AUDIO) < 0)
	{
		SDL_Log("SDL_INIT_AUDIO failed: %s\n", SDL_GetError());
	}
	FAudio_INTERNAL_InitSIMDFunctions(
		SDL_HasSSE2(),
		SDL_HasNEON()
	);
}